

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void Ppmd7_EncodeSymbol(CPpmd7 *p,CPpmd7z_RangeEnc *rc,int symbol)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  Byte BVar5;
  uint numMasked_00;
  uint size;
  uint uVar6;
  uint uVar7;
  CPpmd_See *pCVar8;
  uint in_EDX;
  CPpmd7 *in_RDI;
  CPpmd_State *s1;
  UInt32 low;
  int cur;
  uint numMasked;
  uint i_1;
  UInt32 sum_1;
  CPpmd_State *s_2;
  CPpmd_See *see;
  UInt32 escFreq;
  uint j_1;
  CPpmd_State *s_1;
  UInt16 *prob;
  uint j;
  uint i;
  UInt32 sum;
  CPpmd_State *s;
  size_t charMask [32];
  undefined8 in_stack_fffffffffffffe88;
  UInt32 size0;
  CPpmd_State *pCVar9;
  undefined4 in_stack_fffffffffffffe90;
  UInt32 in_stack_fffffffffffffe94;
  UInt32 in_stack_fffffffffffffe98;
  UInt32 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  uint total;
  CPpmd_State *local_158;
  UInt32 local_148;
  uint local_144;
  CPpmd_State *local_140;
  UInt16 *local_138;
  uint local_12c;
  int local_128;
  uint local_124;
  CPpmd_State *local_120;
  char acStack_118 [8];
  undefined8 auStack_110 [31];
  uint local_14;
  CPpmd7 *local_8;
  
  local_14 = in_EDX;
  local_8 = in_RDI;
  if (in_RDI->MinContext->NumStats == 1) {
    bVar4 = *(byte *)((long)&in_RDI->MinContext->SummFreq + 1);
    bVar2 = in_RDI->NS2BSIndx[(int)(*(ushort *)(in_RDI->Base + in_RDI->MinContext->Suffix) - 1)];
    bVar3 = in_RDI->HB2Flag[in_RDI->FoundState->Symbol];
    in_RDI->HiBitsFlag = (uint)bVar3;
    local_138 = in_RDI->BinSumm[(int)(bVar4 - 1)] +
                (in_RDI->PrevSuccess + (uint)bVar2 + (uint)bVar3 +
                 (uint)in_RDI->HB2Flag[(byte)in_RDI->MinContext->SummFreq] * 2 +
                (in_RDI->RunLength >> 0x1a & 0x20U));
    local_140 = (CPpmd_State *)&in_RDI->MinContext->SummFreq;
    size0 = (UInt32)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    if ((byte)*(UInt16 *)local_140 == in_EDX) {
      RangeEnc_EncodeBit_0
                ((CPpmd7z_RangeEnc *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 size0);
      *local_138 = (*local_138 + 0x80) - (short)((int)(*local_138 + 0x20) >> 7);
      local_8->FoundState = local_140;
      Ppmd7_UpdateBin((CPpmd7 *)0x2c1d20);
      return;
    }
    RangeEnc_EncodeBit_1
              ((CPpmd7z_RangeEnc *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               size0);
    *local_138 = *local_138 - (short)((int)(*local_138 + 0x20) >> 7);
    local_8->InitEsc =
         (uint)"\x19\x0e\t\a\x05\x05\x04\x04\x04\x03\x03\x03\x02\x02\x02\x02"
               [(int)(uint)*local_138 >> 10];
    for (local_144 = 0; local_144 < 0x20; local_144 = local_144 + 8) {
      pcVar1 = acStack_118 + (ulong)local_144 * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_144 + 1) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_144 + 2) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_144 + 3) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_144 + 4) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_144 + 5) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_144 + 6) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_144 + 7) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
    }
    acStack_118[local_140->Symbol] = '\0';
    local_8->PrevSuccess = 0;
  }
  else {
    local_120 = (CPpmd_State *)(in_RDI->Base + in_RDI->MinContext->Stats);
    if (local_120->Symbol == in_EDX) {
      RangeEnc_Encode((CPpmd7z_RangeEnc *)
                      CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                      in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94)
      ;
      local_8->FoundState = local_120;
      Ppmd7_Update1_0((CPpmd7 *)0x2c199d);
      return;
    }
    in_RDI->PrevSuccess = 0;
    local_124 = (uint)local_120->Freq;
    local_128 = in_RDI->MinContext->NumStats - 1;
    do {
      pCVar9 = local_120 + 1;
      if (local_120[1].Symbol == in_EDX) {
        local_120 = pCVar9;
        RangeEnc_Encode((CPpmd7z_RangeEnc *)
                        CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                        in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,
                        in_stack_fffffffffffffe94);
        local_8->FoundState = local_120;
        Ppmd7_Update1((CPpmd7 *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        return;
      }
      local_124 = local_120[1].Freq + local_124;
      local_128 = local_128 + -1;
      local_120 = pCVar9;
    } while (local_128 != 0);
    in_RDI->HiBitsFlag = (uint)in_RDI->HB2Flag[in_RDI->FoundState->Symbol];
    for (local_12c = 0; local_12c < 0x20; local_12c = local_12c + 8) {
      pcVar1 = acStack_118 + (ulong)local_12c * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_12c + 1) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_12c + 2) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_12c + 3) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_12c + 4) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_12c + 5) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_12c + 6) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_12c + 7) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
    }
    acStack_118[pCVar9->Symbol] = '\0';
    local_128 = local_8->MinContext->NumStats - 1;
    do {
      pCVar9 = local_120 + -1;
      acStack_118[local_120[-1].Symbol] = '\0';
      local_128 = local_128 + -1;
      local_120 = pCVar9;
    } while (local_128 != 0);
    RangeEnc_Encode((CPpmd7z_RangeEnc *)
                    CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                    in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
  }
  do {
    numMasked_00 = (uint)local_8->MinContext->NumStats;
    do {
      local_8->OrderFall = local_8->OrderFall + 1;
      if (local_8->MinContext->Suffix == 0) {
        return;
      }
      local_8->MinContext = (CPpmd7_Context *)(local_8->Base + local_8->MinContext->Suffix);
    } while (local_8->MinContext->NumStats == numMasked_00);
    pCVar8 = Ppmd7_MakeEscFreq(local_8,numMasked_00,&local_148);
    local_158 = (CPpmd_State *)(local_8->Base + local_8->MinContext->Stats);
    total = 0;
    uVar7 = (uint)local_8->MinContext->NumStats;
    do {
      pCVar9 = local_158;
      size = (uint)local_158->Symbol;
      uVar6 = total;
      if (size == local_14) {
        do {
          uVar6 = ((uint)local_158->Freq & (int)acStack_118[local_158->Symbol]) + uVar6;
          local_158 = local_158 + 1;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
        RangeEnc_Encode((CPpmd7z_RangeEnc *)((ulong)uVar6 << 0x20),numMasked_00,size,total);
        if ((pCVar8->Shift < 7) &&
           (BVar5 = pCVar8->Count + 0xff, pCVar8->Count = BVar5, BVar5 == '\0')) {
          pCVar8->Summ = pCVar8->Summ << 1;
          bVar4 = pCVar8->Shift;
          pCVar8->Shift = bVar4 + 1;
          pCVar8->Count = (Byte)(3 << (bVar4 & 0x1f));
        }
        local_8->FoundState = pCVar9;
        Ppmd7_Update2((CPpmd7 *)0x2c2021);
        return;
      }
      total = ((uint)local_158->Freq & (int)acStack_118[(int)size]) + total;
      acStack_118[(int)size] = '\0';
      local_158 = local_158 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    RangeEnc_Encode((CPpmd7z_RangeEnc *)((ulong)total << 0x20),numMasked_00,size,
                    in_stack_fffffffffffffe94);
    pCVar8->Summ = pCVar8->Summ + (short)total + (short)local_148;
  } while( true );
}

Assistant:

static void Ppmd7_EncodeSymbol(CPpmd7 *p, CPpmd7z_RangeEnc *rc, int symbol)
{
  size_t charMask[256 / sizeof(size_t)];
  if (p->MinContext->NumStats != 1)
  {
    CPpmd_State *s = Ppmd7_GetStats(p, p->MinContext);
    UInt32 sum;
    unsigned i;
    if (s->Symbol == symbol)
    {
      RangeEnc_Encode(rc, 0, s->Freq, p->MinContext->SummFreq);
      p->FoundState = s;
      Ppmd7_Update1_0(p);
      return;
    }
    p->PrevSuccess = 0;
    sum = s->Freq;
    i = p->MinContext->NumStats - 1;
    do
    {
      if ((++s)->Symbol == symbol)
      {
        RangeEnc_Encode(rc, sum, s->Freq, p->MinContext->SummFreq);
        p->FoundState = s;
        Ppmd7_Update1(p);
        return;
      }
      sum += s->Freq;
    }
    while (--i);
    
    p->HiBitsFlag = p->HB2Flag[p->FoundState->Symbol];
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(s->Symbol) = 0;
    i = p->MinContext->NumStats - 1;
    do { MASK((--s)->Symbol) = 0; } while (--i);
    RangeEnc_Encode(rc, sum, p->MinContext->SummFreq - sum, p->MinContext->SummFreq);
  }
  else
  {
    UInt16 *prob = Ppmd7_GetBinSumm(p);
    CPpmd_State *s = Ppmd7Context_OneState(p->MinContext);
    if (s->Symbol == symbol)
    {
      RangeEnc_EncodeBit_0(rc, *prob);
      *prob = (UInt16)PPMD_UPDATE_PROB_0(*prob);
      p->FoundState = s;
      Ppmd7_UpdateBin(p);
      return;
    }
    else
    {
      RangeEnc_EncodeBit_1(rc, *prob);
      *prob = (UInt16)PPMD_UPDATE_PROB_1(*prob);
      p->InitEsc = PPMD7_kExpEscape[*prob >> 10];
      PPMD_SetAllBitsIn256Bytes(charMask);
      MASK(s->Symbol) = 0;
      p->PrevSuccess = 0;
    }
  }
  for (;;)
  {
    UInt32 escFreq;
    CPpmd_See *see;
    CPpmd_State *s;
    UInt32 sum;
    unsigned i, numMasked = p->MinContext->NumStats;
    do
    {
      p->OrderFall++;
      if (!p->MinContext->Suffix)
        return; /* EndMarker (symbol = -1) */
      p->MinContext = Ppmd7_GetContext(p, p->MinContext->Suffix);
    }
    while (p->MinContext->NumStats == numMasked);
    
    see = Ppmd7_MakeEscFreq(p, numMasked, &escFreq);
    s = Ppmd7_GetStats(p, p->MinContext);
    sum = 0;
    i = p->MinContext->NumStats;
    do
    {
      int cur = s->Symbol;
      if (cur == symbol)
      {
        UInt32 low = sum;
        CPpmd_State *s1 = s;
        do
        {
          sum += (s->Freq & (int)(MASK(s->Symbol)));
          s++;
        }
        while (--i);
        RangeEnc_Encode(rc, low, s1->Freq, sum + escFreq);
        Ppmd_See_Update(see);
        p->FoundState = s1;
        Ppmd7_Update2(p);
        return;
      }
      sum += (s->Freq & (int)(MASK(cur)));
      MASK(cur) = 0;
      s++;
    }
    while (--i);
    
    RangeEnc_Encode(rc, sum, escFreq, sum + escFreq);
    see->Summ = (UInt16)(see->Summ + sum + escFreq);
  }
}